

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

void __thiscall database::Query::_ParseQueryString(Query *this)

{
  pair<database::TransactionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_order_filter_result;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  pair<database::TransactionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  _Transaction_Filter(&local_38,(string *)this);
  *(TransactionType *)(this + 0x24) = local_38.first;
  switch(local_38.first) {
  case create_database:
  case drop_database:
    *(undefined4 *)(this + 0x20) = 0;
    std::__cxx11::string::_M_assign((string *)(this + 0x28));
    break;
  case create_container:
    *(undefined4 *)(this + 0x20) = 0;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:351:65)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:351:65)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseCreateContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    break;
  case insert_into:
    *(undefined4 *)(this + 0x20) = 1;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:362:69)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:362:69)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseInsertIntoContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    break;
  case select_all:
    *(undefined4 *)(this + 0x20) = 1;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:373:72)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:373:72)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseSelectAllFromContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    break;
  case select_dataset:
    *(undefined4 *)(this + 0x20) = 1;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:384:76)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:384:76)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseSelectDataSetFromContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    break;
  case update:
    *(undefined4 *)(this + 0x20) = 1;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:396:65)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:396:65)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseUpdateContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    break;
  case truncate:
    *(undefined4 *)(this + 0x20) = 1;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:408:67)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:408:67)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseTruncateContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    break;
  case delete_from:
    *(undefined4 *)(this + 0x20) = 1;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:429:69)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:429:69)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseDeleteFromContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    break;
  case drop_container:
    *(undefined4 *)(this + 0x20) = 0;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:440:63)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Query.cpp:440:63)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)this;
    _ParseDropContainerQuery
              (&local_38.second,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.second._M_dataplus._M_p != &local_38.second.field_2) {
    operator_delete(local_38.second._M_dataplus._M_p,
                    local_38.second.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void database::Query::_ParseQueryString()
{
  std::pair<database::TransactionType,std::string> first_order_filter_result = _Transaction_Filter(m_query_string);
  m_transaction_type = first_order_filter_result.first;

  //Create Database
  if(m_transaction_type == database::create_database)
  {
    m_transaction_metatype = database::ddl;
    m_database_name = first_order_filter_result.second;
  }

  //Create Container
  else if(m_transaction_type == database::create_container)
  {
    m_transaction_metatype = database::ddl;
    _ParseCreateContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto schema){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_container_schema = schema;
    });
  }

  //Insert into Container
  else if(m_transaction_type == database::insert_into)
  {
    m_transaction_metatype = database::dml;
    _ParseInsertIntoContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto values){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_values = values;
    });
  }

  //Select All from Container
  else if(m_transaction_type == database::select_all)
  {
    m_transaction_metatype = database::dml;
    _ParseSelectAllFromContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto filter){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_filter = filter;
    });
  }

  //Select Dataset from Container
  else if(m_transaction_type == database::select_dataset)
  {
    m_transaction_metatype = database::dml;
    _ParseSelectDataSetFromContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto dataset, auto filter){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_dataset = dataset;
      m_filter = filter;
    });
  }

  //Update Container
  else if(m_transaction_type == database::update)
  {
    m_transaction_metatype = database::dml;
    _ParseUpdateContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName, auto values,auto filter){
      m_database_name = databaseName;
      m_container_name = containerName;
      m_values = values;
      m_filter = filter;
    });
  }

  //Truncate Container
  else if(m_transaction_type == database::truncate)
  {
    m_transaction_metatype = database::dml;
    _ParseTruncateContainerQuery(first_order_filter_result.second,[&](auto databaseName,auto containerName){
      m_database_name = databaseName;
      m_container_name = containerName;
    });
  }

  /*
  !ALTER CONTAINER  - not implemented
  TODO Need to implement the processing for alter container query
  */
  //Alter Container - To Be Adjusted Later
  // else if(m_transaction_type == database::alter)
  // {
  //   m_transaction_metatype = database::ddl;
  // }


  //Delete from Container
  else if(m_transaction_type == database::delete_from)
  {
    m_transaction_metatype = database::dml;
    _ParseDeleteFromContainerQuery(first_order_filter_result.second,[&](auto databaseName,auto containerName,auto filter) {
      m_database_name = databaseName;
      m_container_name = containerName;
      m_filter = filter;
    });
  }

  //Drop Container
  else if(m_transaction_type == database::drop_container)
  {
    m_transaction_metatype = database::ddl;
    _ParseDropContainerQuery(first_order_filter_result.second,[&](auto databaseName, auto containerName){
      m_database_name = databaseName;
      m_container_name = containerName;
    });
  }

  //Drop Database
  else if(m_transaction_type == database::drop_database)
  {
    m_transaction_metatype = database::ddl;
    m_database_name = first_order_filter_result.second;
  }
}